

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void e2e_async_compact_pattern(int n_checkpoints,fdb_config fconfig,bool deletes,bool walflush)

{
  fdb_kvs_handle **ptr_handle;
  fdb_status fVar1;
  storage_t *psVar2;
  bool walflush_00;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  undefined7 in_register_00000031;
  fdb_kvs_info *pfVar7;
  fdb_kvs_handle **ppfVar8;
  int iVar9;
  fdb_kvs_handle *pfVar10;
  int iVar11;
  int iVar12;
  fdb_kvs_config fStack_988;
  idx_prams_t iStack_970;
  checkpoint_t cStack_958;
  ulong uStack_528;
  fdb_kvs_info *pfStack_520;
  fdb_kvs_handle **ppfStack_518;
  storage_t *psStack_510;
  ulong uStack_508;
  code *pcStack_500;
  uint local_4f4;
  undefined1 local_4f0 [32];
  fdb_kvs_config local_4d0;
  timeval local_4b8;
  fdb_kvs_info local_4a8;
  idx_prams_t local_478;
  checkpoint_t local_460;
  
  uVar3 = CONCAT71(in_register_00000031,deletes) & 0xffffffff;
  local_4f0._0_8_ = 0;
  pcStack_500 = (code *)0x1077a4;
  gettimeofday(&local_4b8,(__timezone_ptr_t)0x0);
  pcStack_500 = (code *)0x1077ae;
  fdb_get_default_kvs_config();
  pcStack_500 = (code *)0x1077b3;
  memleak_start();
  pcStack_500 = (code *)0x1077b8;
  rm_storage_fs();
  pcStack_500 = (code *)0x1077c8;
  gen_index_params(&local_478);
  pcStack_500 = (code *)0x1077df;
  memset(&local_460,0,0x430);
  pcStack_500 = (code *)0x107803;
  psVar2 = init_storage(&fconfig,&fconfig,&local_4d0,&local_478,&local_460,walflush);
  pcStack_500 = (code *)0x10781c;
  pthread_create((pthread_t *)(local_4f0 + 8),(pthread_attr_t *)0x0,compact_thread,&fconfig);
  local_4f4 = n_checkpoints;
  if (0 < n_checkpoints) {
    ptr_handle = (fdb_kvs_handle **)(local_4f0 + 0x10);
    do {
      pcStack_500 = (code *)0x10783e;
      load_persons(psVar2);
      uVar5 = 100;
      do {
        pcStack_500 = (code *)0x10784b;
        load_persons(psVar2);
        if ((char)uVar3 != '\0') {
          pcStack_500 = (code *)0x107857;
          delete_persons(psVar2);
        }
        pcStack_500 = (code *)0x107862;
        e2e_fdb_commit(psVar2->main,walflush);
        pfVar10 = psVar2->all_docs;
        pcStack_500 = (code *)0x10786e;
        pfVar7 = &local_4a8;
        fVar1 = fdb_get_kvs_info(pfVar10,&local_4a8);
        cVar6 = (char)pfVar7;
        iVar9 = (int)pfVar10;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pcStack_500 = (code *)0x1078f3;
          e2e_async_compact_pattern();
LAB_001078f3:
          pcStack_500 = e2e_kvs_index_pattern;
          e2e_async_compact_pattern();
          uStack_528 = uVar3;
          pfStack_520 = &local_4a8;
          ppfStack_518 = ptr_handle;
          psStack_510 = psVar2;
          uStack_508 = (ulong)walflush;
          pcStack_500 = (code *)uVar5;
          fdb_get_default_kvs_config();
          memleak_start();
          rm_storage_fs();
          gen_index_params(&iStack_970);
          iVar11 = 0;
          memset(&cStack_958,0,0x430);
          psVar2 = init_storage((fdb_config *)local_4f0,(fdb_config *)local_4f0,&fStack_988,
                                &iStack_970,&cStack_958,walflush_00);
          if (0 < iVar9) {
            do {
              start_checkpoint(psVar2);
              iVar12 = 100;
              do {
                load_persons(psVar2);
                if (cVar6 != '\0') {
                  delete_persons(psVar2);
                }
                verify_db(psVar2);
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
              end_checkpoint(psVar2);
              update_index(psVar2,true);
              verify_db(psVar2);
              iVar11 = iVar11 + 1;
            } while (iVar11 != iVar9);
          }
          if (local_4d0.custom_cmp._6_1_ != '\x01') {
            replay(psVar2);
          }
          e2e_fdb_shutdown(psVar2);
          memleak_end();
          return;
        }
        pfVar10 = psVar2->all_docs;
        pcStack_500 = (code *)0x107883;
        ppfVar8 = ptr_handle;
        fVar1 = fdb_snapshot_open(pfVar10,ptr_handle,local_4a8.last_seqnum);
        cVar6 = (char)ppfVar8;
        iVar9 = (int)pfVar10;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001078f3;
        pcStack_500 = (code *)0x107894;
        update_index(psVar2,true);
        pcStack_500 = (code *)0x10789c;
        verify_db(psVar2);
        pcStack_500 = (code *)0x1078a6;
        fdb_kvs_close((fdb_kvs_handle *)local_4f0._16_8_);
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 0);
      uVar4 = (int)local_4f0._0_8_ + 1;
      local_4f0._0_8_ = ZEXT48(uVar4);
    } while (uVar4 != local_4f4);
  }
  pcStack_500 = (code *)0x1078cf;
  pthread_join(local_4f0._8_8_,(void **)(local_4f0 + 0x18));
  pcStack_500 = (code *)0x1078d7;
  e2e_fdb_shutdown(psVar2);
  pcStack_500 = (code *)0x1078dc;
  memleak_end();
  return;
}

Assistant:

void e2e_async_compact_pattern(int n_checkpoints, fdb_config fconfig,
                               bool deletes, bool walflush) {
    TEST_INIT();
    int n, i;
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_kvs_info info;
    fdb_kvs_handle *snap_db;
    fdb_status status;
    thread_t tid;
    void *thread_ret;
    n_checkpoints = n_checkpoints * LOAD_FACTOR;

    memleak_start();

    // init
    rm_storage_fs();
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));

    // setup
    st = init_storage(&fconfig, &fconfig, &kvs_config,
            &index_params, &verification_checkpoint, walflush);

    // create compaction thread
    thread_create(&tid, compact_thread, (void*)&fconfig);

    // test
    for ( n = 0; n < n_checkpoints; ++n) {

#ifdef __DEBUG_E2E
        printf("checkpoint: %d\n", n);
#endif
        load_persons(st);
        for (i=0;i<100;++i) {
#ifdef __DEBUG_E2E
            printf("\n\n----%d----\n", i);
#endif
            load_persons(st);
            if (deletes) {
                delete_persons(st);
            }
            e2e_fdb_commit(st->main, walflush);
            status = fdb_get_kvs_info(st->all_docs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_snapshot_open(st->all_docs, &snap_db, info.last_seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            update_index(st, true);
            verify_db(st);
            fdb_kvs_close(snap_db);
        }
    }

    thread_join(tid, &thread_ret);
    // teardown
    e2e_fdb_shutdown(st);

    memleak_end();
}